

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4ec2e9::BNTest_NonMinimal_Test::TestBody(BNTest_NonMinimal_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_char_*,_false> orig_ptr;
  _Head_base<0UL,_bio_st_*,_false> a;
  int iVar2;
  uint uVar3;
  BIGNUM *r;
  BIGNUM *a_00;
  BN_MONT_CTX *pBVar4;
  BIO_METHOD *pBVar5;
  BIO *pBVar6;
  AssertHelper *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *pcVar7;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  internal iVar8;
  bool bVar9;
  UniquePtr<BIGNUM> p;
  uint8_t *ptr;
  UniquePtr<BN_MONT_CTX> mont;
  ScopedTrace gtest_trace_2544;
  UniquePtr<BN_MONT_CTX> mont3;
  UniquePtr<BIGNUM> ten;
  UniquePtr<BN_MONT_CTX> mont4;
  UniquePtr<BN_MONT_CTX> mont2;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> ten_copy;
  UniquePtr<BIGNUM> two_exp_256;
  UniquePtr<BIGNUM> forty_two;
  UniquePtr<BIGNUM> eight;
  size_t len;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  undefined1 local_d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  Bytes local_b0;
  AssertHelper local_a0;
  _Head_base<0UL,_bn_mont_ctx_st_*,_false> local_98;
  ScopedTrace local_89;
  _Head_base<0UL,_char_*,_false> local_88;
  _Head_base<0UL,_bignum_st_*,_false> local_80;
  _Head_base<0UL,_bio_st_*,_false> local_78;
  _Head_base<0UL,_bn_mont_ctx_st_*,_false> local_70;
  AssertHelper local_68;
  _Head_base<0UL,_bignum_st_*,_false> local_60;
  _Head_base<0UL,_bignum_st_*,_false> local_58;
  _Head_base<0UL,_bignum_st_*,_false> local_50;
  _Head_base<0UL,_bignum_st_*,_false> local_48;
  _Head_base<0UL,_bignum_st_*,_false> local_40;
  AssertHelper local_38;
  
  local_80._M_head_impl = (bignum_st *)BN_new();
  local_e0._M_head_impl._0_1_ = (internal)((BIGNUM *)local_80._M_head_impl != (BIGNUM *)0x0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_80._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x51eb7c,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9d9,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_b0);
  }
  else {
    iVar2 = BN_set_word((BIGNUM *)local_80._M_head_impl,10);
    local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 != 0) {
      local_58._M_head_impl = (bignum_st *)BN_dup(local_80._M_head_impl);
      local_e0._M_head_impl._0_1_ = (internal)((BIGNUM *)local_58._M_head_impl != (BIGNUM *)0x0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BIGNUM *)local_58._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)"ten_copy","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x9dd,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity + 1
                         );
        }
        if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
          (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
      }
      else {
        local_40._M_head_impl = (bignum_st *)BN_new();
        local_e0._M_head_impl._0_1_ = (internal)((BIGNUM *)local_40._M_head_impl != (BIGNUM *)0x0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((BIGNUM *)local_40._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)"eight","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x9e0,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_b0)
          ;
LAB_002bebf9:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_d0._1_7_,local_d0[0]),
                            local_c0._M_allocated_capacity + 1);
          }
          if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
            (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
          }
          if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8,local_d8);
          }
        }
        else {
          iVar2 = BN_set_word((BIGNUM *)local_40._M_head_impl,8);
          local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)&local_e0,
                       (AssertionResult *)"BN_set_word(eight.get(), 8)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x9e1,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_48,(Message *)&local_b0);
            goto LAB_002bebf9;
          }
          local_48._M_head_impl = (bignum_st *)BN_new();
          local_e0._M_head_impl._0_1_ = (internal)((BIGNUM *)local_48._M_head_impl != (BIGNUM *)0x0)
          ;
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((BIGNUM *)local_48._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)"forty_two",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x9e4,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_50,(Message *)&local_b0);
LAB_002bed1e:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_d0._1_7_,local_d0[0]),
                              local_c0._M_allocated_capacity + 1);
            }
            if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
              (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
            }
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,local_d8);
            }
          }
          else {
            iVar2 = BN_set_word((BIGNUM *)local_48._M_head_impl,0x2a);
            local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)&local_e0,
                         (AssertionResult *)"BN_set_word(forty_two.get(), 42)","false","true",in_R9)
              ;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x9e5,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_50,(Message *)&local_b0);
              goto LAB_002bed1e;
            }
            r = BN_new();
            local_e0._M_head_impl._0_1_ = (internal)(r != (BIGNUM *)0x0);
            local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_50._M_head_impl = (bignum_st *)r;
            if (r == (BIGNUM *)0x0) {
              testing::Message::Message((Message *)&local_b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)"two_exp_256",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_60,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x9e8,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_60,(Message *)&local_b0);
LAB_002bee43:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                local_c0._M_allocated_capacity + 1);
              }
              if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
              }
              if (local_d8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,local_d8);
              }
            }
            else {
              a_00 = BN_value_one();
              iVar2 = BN_lshift(r,a_00,0x100);
              local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_d0,(internal *)&local_e0,
                           (AssertionResult *)"BN_lshift(two_exp_256.get(), BN_value_one(), 256)",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x9e9,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_60,(Message *)&local_b0);
                goto LAB_002bee43;
              }
              local_60._M_head_impl = (bignum_st *)BN_new();
              local_e0._M_head_impl._0_1_ =
                   (internal)((BIGNUM *)local_60._M_head_impl != (BIGNUM *)0x0);
              local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((BIGNUM *)local_60._M_head_impl == (BIGNUM *)0x0) {
                testing::Message::Message((Message *)&local_b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x5120f6,
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x9ec,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_98,(Message *)&local_b0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                  local_c0._M_allocated_capacity + 1);
                }
                if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                  (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                }
                if (local_d8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_d8,local_d8);
                }
              }
              else {
                BN_zero(local_60._M_head_impl);
                local_98._M_head_impl = (BN_MONT_CTX *)0x1;
                do {
                  testing::ScopedTrace::ScopedTrace<unsigned_long>
                            (&local_89,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x9f0,(unsigned_long *)&local_98);
                  iVar2 = bn_resize_words(local_80._M_head_impl,(size_t)local_98._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"bn_resize_words(ten.get(), width)","false","true"
                               ,in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f2,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_70,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  local_e0._M_head_impl._0_4_ = local_98._M_head_impl._0_4_;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_d0,"static_cast<int>(width)","ten->width",
                             (int *)&local_e0,&(local_80._M_head_impl)->width);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f3,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = bn_resize_words(local_60._M_head_impl,(size_t)local_98._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"bn_resize_words(zero.get(), width)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f4,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_70,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  local_e0._M_head_impl._0_4_ = local_98._M_head_impl._0_4_;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_d0,"static_cast<int>(width)","zero->width",
                             (int *)&local_e0,&(local_60._M_head_impl)->width);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f5,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_abs_is_word(local_80._M_head_impl,10);
                  iVar8 = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  local_e0._M_head_impl._0_1_ = iVar8;
                  if (!(bool)iVar8) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_abs_is_word(ten.get(), 10)","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f7,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_70,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_is_word(local_80._M_head_impl,10);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_is_word(ten.get(), 10)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f8,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_70,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  local_b0.span_.data_ = (uchar *)CONCAT44(local_b0.span_.data_._4_4_,10);
                  local_e0._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       BN_get_word((BIGNUM *)local_80._M_head_impl);
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            ((internal *)local_d0,"10u","BN_get_word(ten.get())",(uint *)&local_b0,
                             (unsigned_long *)&local_e0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9f9,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_get_u64(local_80._M_head_impl,(uint64_t *)&local_70);
                  _Var1._M_head_impl = local_e0._M_head_impl;
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_get_u64(ten.get(), &v)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fb,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
LAB_002bf2b7:
                    testing::ScopedTrace::~ScopedTrace(&local_89);
                    goto LAB_002bf2c1;
                  }
                  local_e0._M_head_impl._4_4_ = SUB84(_Var1._M_head_impl,4);
                  local_e0._M_head_impl._0_4_ = 10;
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            ((internal *)local_d0,"10u","v",(uint *)&local_e0,
                             (unsigned_long *)&local_70);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fc,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_equal_consttime(local_80._M_head_impl,local_58._M_head_impl);
                  iVar8 = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  local_e0._M_head_impl._0_1_ = iVar8;
                  if (!(bool)iVar8) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), ten_copy.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9fe,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_equal_consttime(local_58._M_head_impl,local_80._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_equal_consttime(ten_copy.get(), ten.get())",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x9ff,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_80._M_head_impl,(BIGNUM *)local_58._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_d0,"BN_cmp(ten.get(), ten_copy.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa00,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_58._M_head_impl,(BIGNUM *)local_80._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)local_d0,"BN_cmp(ten_copy.get(), ten.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa01,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_equal_consttime(local_80._M_head_impl,local_40._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 == 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), eight.get())",
                               "true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa03,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((long *)local_b0.span_.data_ != (long *)0x0) {
                      (**(code **)(*(long *)local_b0.span_.data_ + 8))();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_40._M_head_impl,(BIGNUM *)local_80._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)local_d0,"BN_cmp(eight.get(), ten.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa04,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_80._M_head_impl,(BIGNUM *)local_40._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)local_d0,"BN_cmp(ten.get(), eight.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa05,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_equal_consttime(local_80._M_head_impl,local_48._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 == 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), forty_two.get())",
                               "true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa07,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((long *)local_b0.span_.data_ != (long *)0x0) {
                      (**(code **)(*(long *)local_b0.span_.data_ + 8))();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_48._M_head_impl,(BIGNUM *)local_80._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)local_d0,"BN_cmp(forty_two.get(), ten.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa08,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_80._M_head_impl,(BIGNUM *)local_48._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)local_d0,"BN_cmp(ten.get(), forty_two.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa09,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_equal_consttime(local_80._M_head_impl,local_50._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 == 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_equal_consttime(ten.get(), two_exp_256.get())"
                               ,"true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0b,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((long *)local_b0.span_.data_ != (long *)0x0) {
                      (**(code **)(*(long *)local_b0.span_.data_ + 8))();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_50._M_head_impl,(BIGNUM *)local_80._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperGT<int,int>
                            ((internal *)local_d0,"BN_cmp(two_exp_256.get(), ten.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0c,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_cmp((BIGNUM *)local_80._M_head_impl,(BIGNUM *)local_50._M_head_impl);
                  local_e0._M_head_impl._0_4_ = iVar2;
                  local_b0.span_.data_ = (uchar *)((ulong)local_b0.span_.data_ & 0xffffffff00000000)
                  ;
                  testing::internal::CmpHelperLT<int,int>
                            ((internal *)local_d0,"BN_cmp(ten.get(), two_exp_256.get())","0",
                             (int *)&local_e0,(int *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0d,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  local_e0._M_head_impl._0_4_ = 4;
                  iVar2 = BN_num_bits((BIGNUM *)local_80._M_head_impl);
                  local_b0.span_.data_ = (uchar *)CONCAT44(local_b0.span_.data_._4_4_,iVar2);
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)local_d0,"4u","BN_num_bits(ten.get())",(uint *)&local_e0,
                             (uint *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa0f,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  local_e0._M_head_impl._0_4_ = 1;
                  uVar3 = BN_num_bytes(local_80._M_head_impl);
                  local_b0.span_.data_ = (uchar *)CONCAT44(local_b0.span_.data_._4_4_,uVar3);
                  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                            ((internal *)local_d0,"1u","BN_num_bytes(ten.get())",(uint *)&local_e0,
                             (uint *)&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa10,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  iVar2 = BN_is_pow2(local_80._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 == 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 != 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_is_pow2(ten.get())","true","false",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa11,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_b0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  local_88._M_head_impl = BN_bn2hex((BIGNUM *)local_80._M_head_impl);
                  testing::internal::CmpHelperSTREQ
                            ((internal *)local_d0,"\"0a\"","hex.get()","0a",local_88._M_head_impl);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa14,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  pBVar4 = (BN_MONT_CTX *)BN_bn2hex((BIGNUM *)local_60._M_head_impl);
                  orig_ptr._M_head_impl = local_88._M_head_impl;
                  bVar9 = local_88._M_head_impl != (char *)0x0;
                  local_88._M_head_impl = (char *)pBVar4;
                  if (bVar9) {
                    OPENSSL_free(orig_ptr._M_head_impl);
                  }
                  testing::internal::CmpHelperSTREQ
                            ((internal *)local_d0,"\"0\"","hex.get()","0",local_88._M_head_impl);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa16,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  pBVar5 = BIO_s_mem();
                  local_78._M_head_impl = (bio_st *)BIO_new(pBVar5);
                  local_e0._M_head_impl._0_1_ =
                       (internal)((BIO *)local_78._M_head_impl != (BIO *)0x0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if ((BIO *)local_78._M_head_impl == (BIO *)0x0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x596543,
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa19,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
LAB_002bf0b4:
                    this_00 = &local_a0;
LAB_002bf25e:
                    testing::internal::AssertHelper::~AssertHelper(this_00);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                      (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                    std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_78);
                    std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<char,_bssl::internal::Deleter> *)&local_88);
                    goto LAB_002bf2b7;
                  }
                  iVar2 = BN_print(local_78._M_head_impl,(BIGNUM *)local_80._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_print(bio.get(), ten.get())","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_a0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa1a,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
                    goto LAB_002bf0b4;
                  }
                  iVar2 = BIO_mem_contents(local_78._M_head_impl,(uint8_t **)&local_a0,
                                           (size_t *)&local_38);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BIO_mem_contents(bio.get(), &ptr, &len)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa1d,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b0);
LAB_002bf256:
                    this_00 = &local_68;
                    goto LAB_002bf25e;
                  }
                  local_e0._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (anon_var_dwarf_1aa588 + 0xc);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1;
                  local_b0.span_.data_ = (uchar *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_)
                  ;
                  local_b0.span_.size_ = (size_t)local_38.data_;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_d0,"Bytes(\"a\")","Bytes(ptr, len)",
                             (Bytes *)&local_e0,&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa21,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  pBVar5 = BIO_s_mem();
                  pBVar6 = BIO_new(pBVar5);
                  a._M_head_impl = local_78._M_head_impl;
                  bVar9 = (BIO *)local_78._M_head_impl != (BIO *)0x0;
                  local_78._M_head_impl = (bio_st *)pBVar6;
                  if (bVar9) {
                    BIO_free((BIO *)a._M_head_impl);
                  }
                  local_e0._M_head_impl._0_1_ =
                       (internal)((BIO *)local_78._M_head_impl != (BIO *)0x0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if ((BIO *)local_78._M_head_impl == (BIO *)0x0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x596543,
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa24,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b0);
                    goto LAB_002bf256;
                  }
                  iVar2 = BN_print(local_78._M_head_impl,(BIGNUM *)local_60._M_head_impl);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BN_print(bio.get(), zero.get())","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa25,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b0);
                    goto LAB_002bf256;
                  }
                  iVar2 = BIO_mem_contents(local_78._M_head_impl,(uint8_t **)&local_a0,
                                           (size_t *)&local_38);
                  local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_b0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,
                               (AssertionResult *)"BIO_mem_contents(bio.get(), &ptr, &len)","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa26,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b0);
                    goto LAB_002bf256;
                  }
                  local_e0._M_head_impl =
                       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       0x58c192;
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1;
                  local_b0.span_.data_ = (uchar *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_)
                  ;
                  local_b0.span_.size_ = (size_t)local_38.data_;
                  testing::internal::CmpHelperEQ<Bytes,Bytes>
                            ((internal *)local_d0,"Bytes(\"0\")","Bytes(ptr, len)",
                             (Bytes *)&local_e0,&local_b0);
                  if (local_d0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_e0);
                    pcVar7 = "";
                    if (local_c8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar7 = (local_c8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_b0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa27,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_b0,(Message *)&local_e0);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                    if (local_e0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                    }
                  }
                  if (local_c8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_c8,local_c8);
                  }
                  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_78);
                  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<char,_bssl::internal::Deleter> *)&local_88);
                  testing::ScopedTrace::~ScopedTrace(&local_89);
                  local_98._M_head_impl =
                       (bn_mont_ctx_st *)((long)&((local_98._M_head_impl)->RR).d + 1);
                } while (local_98._M_head_impl < (BN_MONT_CTX *)0xa);
                iVar2 = bn_resize_words(local_80._M_head_impl,1);
                local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,
                             (AssertionResult *)"bn_resize_words(ten.get(), 1)","false","true",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2b,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                local_e0._M_head_impl._0_4_ = 1;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_d0,"1","ten->width",(int *)&local_e0,
                           &(local_80._M_head_impl)->width);
                if (local_d0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_e0);
                  if (local_c8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = (local_c8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2c,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_b0,(Message *)&local_e0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                  if (local_e0._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                  }
                }
                if (local_c8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c8,local_c8);
                }
                iVar2 = bn_resize_words(local_80._M_head_impl,0);
                iVar8 = (internal)(iVar2 == 0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_e0._M_head_impl._0_1_ = iVar8;
                if (!(bool)iVar8) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,
                             (AssertionResult *)"bn_resize_words(ten.get(), 0)","true","false",in_R9
                            );
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa2f,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                iVar2 = BN_is_pow2(local_40._M_head_impl);
                local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (!(bool)local_e0._M_head_impl._0_1_) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,
                             (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa31,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                iVar2 = bn_resize_words(local_40._M_head_impl,4);
                local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,
                             (AssertionResult *)"bn_resize_words(eight.get(), 4)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa32,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                local_e0._M_head_impl._0_4_ = 4;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_d0,"4","eight->width",(int *)&local_e0,
                           &(local_40._M_head_impl)->width);
                if (local_d0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_e0);
                  if (local_c8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar7 = "";
                  }
                  else {
                    pcVar7 = (local_c8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_b0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa33,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_b0,(Message *)&local_e0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
                  if (local_e0._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                  }
                }
                if (local_c8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_c8,local_c8);
                }
                iVar2 = BN_is_pow2(local_40._M_head_impl);
                iVar8 = (internal)(iVar2 != 0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_e0._M_head_impl._0_1_ = iVar8;
                if (!(bool)iVar8) {
                  testing::Message::Message((Message *)&local_b0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,
                             (AssertionResult *)"BN_is_pow2(eight.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa34,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_b0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
                    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                local_b0.span_.data_ = (uchar *)BN_bin2bn(TestBody::kP,0x20,(BIGNUM *)0x0);
                local_e0._M_head_impl._0_1_ =
                     (internal)((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0);
                local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if ((BIGNUM *)local_b0.span_.data_ == (BIGNUM *)0x0) {
                  testing::Message::Message((Message *)&local_98);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x54bfec,
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_70,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0xa3f,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_70,(Message *)&local_98);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                    local_c0._M_allocated_capacity + 1);
                  }
                  if (local_98._M_head_impl != (BN_MONT_CTX *)0x0) {
                    (*(code *)((local_98._M_head_impl)->RR).d[1])();
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                }
                else {
                  local_98._M_head_impl =
                       BN_MONT_CTX_new_for_modulus
                                 ((BIGNUM *)local_b0.span_.data_,
                                  (this->super_BNTest).ctx_._M_t.
                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                  local_e0._M_head_impl._0_1_ =
                       (internal)(local_98._M_head_impl != (BN_MONT_CTX *)0x0);
                  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (local_98._M_head_impl == (BN_MONT_CTX *)0x0) {
                    testing::Message::Message((Message *)&local_70);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)0x561374,
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_88,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0xa45,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_88,(Message *)&local_70);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                      local_c0._M_allocated_capacity + 1);
                    }
                    if (local_70._M_head_impl != (BN_MONT_CTX *)0x0) {
                      (*(code *)((local_70._M_head_impl)->RR).d[1])();
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                  }
                  else {
                    local_70._M_head_impl =
                         BN_MONT_CTX_new_consttime
                                   ((BIGNUM *)local_b0.span_.data_,
                                    (this->super_BNTest).ctx_._M_t.
                                    super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                    local_e0._M_head_impl._0_1_ =
                         (internal)(local_70._M_head_impl != (BN_MONT_CTX *)0x0);
                    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (local_70._M_head_impl == (BN_MONT_CTX *)0x0) {
                      testing::Message::Message((Message *)&local_88);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_d0,(internal *)&local_e0,(AssertionResult *)"mont2"
                                 ,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_78,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0xa47,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_78,(Message *)&local_88);
LAB_002bfade:
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                        local_c0._M_allocated_capacity + 1);
                      }
                      if ((BN_MONT_CTX *)local_88._M_head_impl != (BN_MONT_CTX *)0x0) {
                        (**(code **)(*(long *)local_88._M_head_impl + 8))();
                      }
                      if (local_d8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_d8,local_d8);
                      }
                    }
                    else {
                      iVar2 = bn_resize_words((BIGNUM *)local_b0.span_.data_,0x20);
                      local_e0._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar2 == 0) {
                        testing::Message::Message((Message *)&local_88);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_d0,(internal *)&local_e0,
                                   (AssertionResult *)"bn_resize_words(p.get(), 32)","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_78,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa49,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_78,(Message *)&local_88);
                        goto LAB_002bfade;
                      }
                      local_88._M_head_impl =
                           (char *)BN_MONT_CTX_new_for_modulus
                                             ((BIGNUM *)local_b0.span_.data_,
                                              (this->super_BNTest).ctx_._M_t.
                                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                              _M_head_impl);
                      local_e0._M_head_impl._0_1_ =
                           (internal)((BN_MONT_CTX *)local_88._M_head_impl != (BN_MONT_CTX *)0x0);
                      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if ((BN_MONT_CTX *)local_88._M_head_impl == (BN_MONT_CTX *)0x0) {
                        testing::Message::Message((Message *)&local_78);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_d0,(internal *)&local_e0,
                                   (AssertionResult *)"mont3","false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_a0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0xa4c,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_a0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                          local_c0._M_allocated_capacity + 1);
                        }
                        if ((BIO *)local_78._M_head_impl != (BIO *)0x0) {
                          (*(code *)((BIO_METHOD *)(local_78._M_head_impl)->method)->name)();
                        }
                        if (local_d8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_d8,local_d8);
                        }
                      }
                      else {
                        local_78._M_head_impl =
                             (bio_st *)
                             BN_MONT_CTX_new_consttime
                                       ((BIGNUM *)local_b0.span_.data_,
                                        (this->super_BNTest).ctx_._M_t.
                                        super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                        local_e0._M_head_impl._0_1_ =
                             (internal)((BIO *)local_78._M_head_impl != (BIO *)0x0);
                        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                        if ((BIO *)local_78._M_head_impl == (BIO *)0x0) {
                          this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_d8;
                          testing::Message::Message((Message *)&local_a0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_d0,(internal *)&local_e0,
                                     (AssertionResult *)"mont4","false","true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_38,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0xa4e,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
                          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_38);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
                            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)CONCAT71(local_d0._1_7_,local_d0[0]),
                                            local_c0._M_allocated_capacity + 1);
                          }
                          if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) !=
                              (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_)
                                        + 8))();
                          }
                          local_c8 = local_d8;
                          if (local_d8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) goto LAB_002c0315;
                        }
                        else {
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont2->N.width",
                                     &((local_98._M_head_impl)->N).width,
                                     &((local_70._M_head_impl)->N).width);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa50,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont3->N.width",
                                     &((local_98._M_head_impl)->N).width,
                                     (int *)(local_88._M_head_impl + 0x20));
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa51,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont4->N.width",
                                     &((local_98._M_head_impl)->N).width,
                                     &(local_78._M_head_impl)->num);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa52,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
                          local_a0.data_._0_4_ =
                               BN_cmp((BIGNUM *)local_98._M_head_impl,
                                      (BIGNUM *)local_70._M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"0","BN_cmp(&mont->RR, &mont2->RR)",
                                     (int *)&local_e0,(int *)&local_a0);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa53,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
                          local_a0.data_._0_4_ =
                               BN_cmp((BIGNUM *)local_98._M_head_impl,
                                      (BIGNUM *)local_88._M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"0","BN_cmp(&mont->RR, &mont3->RR)",
                                     (int *)&local_e0,(int *)&local_a0);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa54,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
                          local_a0.data_._0_4_ =
                               BN_cmp((BIGNUM *)local_98._M_head_impl,
                                      (BIGNUM *)local_78._M_head_impl);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"0","BN_cmp(&mont->RR, &mont4->RR)",
                                     (int *)&local_e0,(int *)&local_a0);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa55,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont->RR.width",
                                     &((local_98._M_head_impl)->N).width,
                                     &((local_98._M_head_impl)->RR).width);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa56,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont2->RR.width",
                                     &((local_98._M_head_impl)->N).width,
                                     &((local_70._M_head_impl)->RR).width);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa57,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont3->RR.width",
                                     &((local_98._M_head_impl)->N).width,
                                     (int *)(local_88._M_head_impl + 8));
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar7 = "";
                            }
                            else {
                              pcVar7 = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa58,pcVar7);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_c8,local_c8);
                          }
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)local_d0,"mont->N.width","mont4->RR.width",
                                     &((local_98._M_head_impl)->N).width,
                                     (int *)&(local_78._M_head_impl)->ex_data);
                          if (local_d0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_e0);
                            if (local_c8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              message = "";
                            }
                            else {
                              message = (local_c8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_a0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                       ,0xa59,message);
                            testing::internal::AssertHelper::operator=
                                      (&local_a0,(Message *)&local_e0);
                            testing::internal::AssertHelper::~AssertHelper(&local_a0);
                            if (local_e0._M_head_impl !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) {
                              (**(code **)(*(long *)local_e0._M_head_impl + 8))();
                            }
                          }
                          if (local_c8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_c8;
LAB_002c0315:
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()(this_01,local_c8);
                          }
                        }
                        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                  ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_78)
                        ;
                      }
                      std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_88);
                    }
                    std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_70);
                  }
                  std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_98);
                }
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_b0);
              }
LAB_002bf2c1:
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_60);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_50);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_40);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_58);
      goto LAB_002bf302;
    }
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d0,(internal *)&local_e0,
               (AssertionResult *)"BN_set_word(ten.get(), 10)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x9da,(char *)CONCAT71(local_d0._1_7_,local_d0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_b0);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._1_7_,local_d0[0]) != &local_c0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_d0._1_7_,local_d0[0]),local_c0._M_allocated_capacity + 1);
  }
  if ((BIGNUM *)local_b0.span_.data_ != (BIGNUM *)0x0) {
    (*(code *)(*(ulong **)local_b0.span_.data_)[1])();
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
LAB_002bf302:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_80);
  return;
}

Assistant:

TEST_F(BNTest, NonMinimal) {
  bssl::UniquePtr<BIGNUM> ten(BN_new());
  ASSERT_TRUE(ten);
  ASSERT_TRUE(BN_set_word(ten.get(), 10));

  bssl::UniquePtr<BIGNUM> ten_copy(BN_dup(ten.get()));
  ASSERT_TRUE(ten_copy);

  bssl::UniquePtr<BIGNUM> eight(BN_new());
  ASSERT_TRUE(eight);
  ASSERT_TRUE(BN_set_word(eight.get(), 8));

  bssl::UniquePtr<BIGNUM> forty_two(BN_new());
  ASSERT_TRUE(forty_two);
  ASSERT_TRUE(BN_set_word(forty_two.get(), 42));

  bssl::UniquePtr<BIGNUM> two_exp_256(BN_new());
  ASSERT_TRUE(two_exp_256);
  ASSERT_TRUE(BN_lshift(two_exp_256.get(), BN_value_one(), 256));

  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(zero);
  BN_zero(zero.get());

  for (size_t width = 1; width < 10; width++) {
    SCOPED_TRACE(width);
    // Make |ten| and |zero| wider.
    EXPECT_TRUE(bn_resize_words(ten.get(), width));
    EXPECT_EQ(static_cast<int>(width), ten->width);
    EXPECT_TRUE(bn_resize_words(zero.get(), width));
    EXPECT_EQ(static_cast<int>(width), zero->width);

    EXPECT_TRUE(BN_abs_is_word(ten.get(), 10));
    EXPECT_TRUE(BN_is_word(ten.get(), 10));
    EXPECT_EQ(10u, BN_get_word(ten.get()));
    uint64_t v;
    ASSERT_TRUE(BN_get_u64(ten.get(), &v));
    EXPECT_EQ(10u, v);

    EXPECT_TRUE(BN_equal_consttime(ten.get(), ten_copy.get()));
    EXPECT_TRUE(BN_equal_consttime(ten_copy.get(), ten.get()));
    EXPECT_EQ(BN_cmp(ten.get(), ten_copy.get()), 0);
    EXPECT_EQ(BN_cmp(ten_copy.get(), ten.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), eight.get()));
    EXPECT_LT(BN_cmp(eight.get(), ten.get()), 0);
    EXPECT_GT(BN_cmp(ten.get(), eight.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), forty_two.get()));
    EXPECT_GT(BN_cmp(forty_two.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), forty_two.get()), 0);

    EXPECT_FALSE(BN_equal_consttime(ten.get(), two_exp_256.get()));
    EXPECT_GT(BN_cmp(two_exp_256.get(), ten.get()), 0);
    EXPECT_LT(BN_cmp(ten.get(), two_exp_256.get()), 0);

    EXPECT_EQ(4u, BN_num_bits(ten.get()));
    EXPECT_EQ(1u, BN_num_bytes(ten.get()));
    EXPECT_FALSE(BN_is_pow2(ten.get()));

    bssl::UniquePtr<char> hex(BN_bn2hex(ten.get()));
    EXPECT_STREQ("0a", hex.get());
    hex.reset(BN_bn2hex(zero.get()));
    EXPECT_STREQ("0", hex.get());

    bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), ten.get()));
    const uint8_t *ptr;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    // TODO(davidben): |BN_print| removes leading zeros within a byte, while
    // |BN_bn2hex| rounds up to a byte, except for zero which it prints as
    // "0". Fix this discrepancy?
    EXPECT_EQ(Bytes("a"), Bytes(ptr, len));

    bio.reset(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(bio);
    ASSERT_TRUE(BN_print(bio.get(), zero.get()));
    ASSERT_TRUE(BIO_mem_contents(bio.get(), &ptr, &len));
    EXPECT_EQ(Bytes("0"), Bytes(ptr, len));
  }

  // |ten| may be resized back down to one word.
  EXPECT_TRUE(bn_resize_words(ten.get(), 1));
  EXPECT_EQ(1, ten->width);

  // But not to zero words, which it does not fit.
  EXPECT_FALSE(bn_resize_words(ten.get(), 0));

  EXPECT_TRUE(BN_is_pow2(eight.get()));
  EXPECT_TRUE(bn_resize_words(eight.get(), 4));
  EXPECT_EQ(4, eight->width);
  EXPECT_TRUE(BN_is_pow2(eight.get()));

  // |BN_MONT_CTX| is always stored minimally and uses the same R independent of
  // input width. Additionally, mont->RR is always the same width as mont->N,
  // even if it fits in a smaller value.
  static const uint8_t kP[] = {
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
      0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x01,
  };
  bssl::UniquePtr<BIGNUM> p(BN_bin2bn(kP, sizeof(kP), nullptr));
  ASSERT_TRUE(p);

  // Test both the constant-time and variable-time functions at both minimal and
  // non-minimal |p|.
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont);
  bssl::UniquePtr<BN_MONT_CTX> mont2(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont2);

  ASSERT_TRUE(bn_resize_words(p.get(), 32));
  bssl::UniquePtr<BN_MONT_CTX> mont3(
      BN_MONT_CTX_new_for_modulus(p.get(), ctx()));
  ASSERT_TRUE(mont3);
  bssl::UniquePtr<BN_MONT_CTX> mont4(BN_MONT_CTX_new_consttime(p.get(), ctx()));
  ASSERT_TRUE(mont4);

  EXPECT_EQ(mont->N.width, mont2->N.width);
  EXPECT_EQ(mont->N.width, mont3->N.width);
  EXPECT_EQ(mont->N.width, mont4->N.width);
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont2->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont3->RR));
  EXPECT_EQ(0, BN_cmp(&mont->RR, &mont4->RR));
  EXPECT_EQ(mont->N.width, mont->RR.width);
  EXPECT_EQ(mont->N.width, mont2->RR.width);
  EXPECT_EQ(mont->N.width, mont3->RR.width);
  EXPECT_EQ(mont->N.width, mont4->RR.width);
}